

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_fwd.hpp
# Opt level: O3

region * __thiscall
toml::detail::syntax::non_ascii::scan(region *__return_storage_ptr__,non_ascii *this,location *loc)

{
  pointer psVar1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  scanner_storage *other;
  pointer psVar3;
  
  psVar3 = (this->scanner_).others_.
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->scanner_).others_.
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar3 == psVar1) {
      region::region(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _Var2._M_head_impl =
         (psVar3->scanner_)._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var2._M_head_impl)->_vptr_scanner_base[2])(__return_storage_ptr__,_Var2._M_head_impl,loc);
    if ((__return_storage_ptr__->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) break;
    region::~region(__return_storage_ptr__);
    psVar3 = psVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

region scan(location& loc) const override
    {
        return scanner_.scan(loc);
    }